

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::ines_header_bytes_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,uint8_t mapper_id,
          uint8_t prg_rom_size,uint8_t chr_rom_size,uint8_t prg_ram_size)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  char cVar4;
  ulong *puVar5;
  uint8_t *local_48;
  char *raw;
  INesHeader header;
  uint8_t prg_ram_size_local;
  uint8_t chr_rom_size_local;
  uint8_t prg_rom_size_local;
  uint8_t mapper_id_local;
  string *bytes;
  
  header.zeros[0] = (uint8_t)this;
  header.nes[1] = '\0';
  header.nes[2] = '\0';
  header.nes[3] = '\0';
  local_48 = &header.prg_rom_size;
  header.prg_ram_size = chr_rom_size;
  header.flags_9 = prg_rom_size;
  header.flags_10 = mapper_id;
  unique0x100000e1 = __return_storage_ptr__;
  do {
    *local_48 = '\0';
    uVar3 = header.zeros[0];
    uVar2 = header.flags_10;
    uVar1 = header.flags_9;
    local_48 = local_48 + 1;
  } while (local_48 != &header.prg_ram_size);
  cVar4 = header.zeros[0] << 4;
  header.nes[0] = header.prg_ram_size;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (__return_storage_ptr__,0x10);
  puVar5 = (ulong *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::data(__return_storage_ptr__);
  *puVar5 = CONCAT17(uVar3,CONCAT16(cVar4,CONCAT15(uVar1,CONCAT14(uVar2,0x1a53454e)))) &
            0xf0ffffffffffffff;
  puVar5[1] = CONCAT44(header._4_4_,
                       CONCAT13(header.nes[3],
                                CONCAT12(header.nes[2],CONCAT11(header.nes[1],header.nes[0]))));
  return __return_storage_ptr__;
}

Assistant:

std::string ines_header_bytes(const uint8_t mapper_id,
        const uint8_t prg_rom_size,
        const uint8_t chr_rom_size,
        const uint8_t prg_ram_size) {
    INesHeader header{};
    header.flags_6 =
            static_cast<uint8_t>(mapper_id & static_cast<uint8_t>(0x0Fu)) << 4u;
    header.flags_7 =
            static_cast<uint8_t>(mapper_id & static_cast<uint8_t>(0xF0u));
    header.prg_rom_size = prg_rom_size;
    header.chr_rom_size = chr_rom_size;
    header.prg_ram_size = prg_ram_size;

    std::string bytes;
    bytes.resize(sizeof(header));

    char *const raw = bytes.data();
    std::memcpy(raw, &header, sizeof(header));

    return bytes;
}